

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementMeta.h
# Opt level: O0

void __thiscall Rml::ElementMeta::ElementMeta(ElementMeta *this,Element *el)

{
  Element *el_local;
  ElementMeta *this_local;
  
  itlib::
  flat_map<Rml::EventId,_Rml::EventListener_*,_itlib::fmimpl::less,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  ::flat_map(&this->attribute_event_listeners);
  EventDispatcher::EventDispatcher(&this->event_dispatcher,el);
  ElementStyle::ElementStyle(&this->style,el);
  ElementBackgroundBorder::ElementBackgroundBorder(&this->background_border);
  ElementEffects::ElementEffects(&this->effects,el);
  ElementScroll::ElementScroll(&this->scroll,el);
  Style::ComputedValues::ComputedValues(&this->computed_values,el);
  return;
}

Assistant:

explicit ElementMeta(Element* el) : event_dispatcher(el), style(el), background_border(), effects(el), scroll(el), computed_values(el) {}